

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

void __thiscall ev3dev::button::button(button *this,int bit)

{
  allocator_type *this_00;
  allocator_type *paVar1;
  char *path;
  undefined4 in_ESI;
  allocator_type *in_RDI;
  file_descriptor *in_stack_ffffffffffffffa8;
  function<void_(bool)> *in_stack_ffffffffffffffb0;
  
  paVar1 = in_RDI;
  std::function<void_(bool)>::function(in_stack_ffffffffffffffb0);
  *(undefined4 *)(paVar1 + 0x20) = in_ESI;
  paVar1[0x24] = (allocator_type)0x0;
  this_00 = paVar1 + 0x28;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x13963c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,(size_type)paVar1,
             in_RDI);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x13965c);
  paVar1 = in_RDI + 0x40;
  path = (char *)operator_new(4);
  file_descriptor::file_descriptor((file_descriptor *)in_RDI,path,(int)((ulong)paVar1 >> 0x20));
  std::shared_ptr<ev3dev::button::file_descriptor>::shared_ptr<ev3dev::button::file_descriptor,void>
            ((shared_ptr<ev3dev::button::file_descriptor> *)paVar1,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

button::button(int bit)
    : _bit(bit),
      _buf((KEY_CNT + bits_per_long - 1) / bits_per_long),
      _fd( new file_descriptor("/dev/input/by-path/platform-gpio_keys-event", O_RDONLY) )
{ }